

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNearestNeighborsClassifierValidator.cpp
# Opt level: O1

Result * CoreML::validate<(MLModelType)404>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint32 uVar2;
  char cVar3;
  bool bVar4;
  NeuralNetworkRegressor *pNVar5;
  KNearestNeighborsClassifier *pKVar6;
  Type *pTVar7;
  ostream *poVar8;
  Int64Parameter *int64Parameter;
  int iVar9;
  int iVar10;
  undefined1 in_R9B;
  NearestNeighborsIndex *pNVar11;
  Result res;
  stringstream out;
  string local_1f8;
  ostream *local_1d8;
  _Alloc_hider local_1d0;
  size_type local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  if (format->_oneof_case_[0] == 0x194) {
    pNVar5 = (format->Type_).neuralnetworkregressor_;
  }
  else {
    pNVar5 = (NeuralNetworkRegressor *)
             Specification::KNearestNeighborsClassifier::default_instance();
  }
  local_1b0 = (undefined1  [8])local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"numberOfNeighbors","");
  int64Parameter = *(Int64Parameter **)&(pNVar5->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (int64Parameter == (Int64Parameter *)0x0) {
    int64Parameter = (Int64Parameter *)&Specification::_Int64Parameter_default_instance_;
  }
  validateInt64Parameter((Result *)&local_1d8,(string *)local_1b0,int64Parameter,true);
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0._0_8_ + 1);
  }
  bVar4 = Result::good((Result *)&local_1d8);
  if (!bVar4) {
LAB_0027af3b:
    *(ostream **)__return_storage_ptr__ = local_1d8;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_p == &local_1c0) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_1c0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_1d0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_1c8;
    local_1c8 = 0;
    local_1c0._M_local_buf[0] = '\0';
    local_1d0._M_p = (pointer)&local_1c0;
    goto LAB_0027b3a6;
  }
  cVar3 = (char)(ostream *)local_1a0;
  if (*(uint32 *)((long)&pNVar5->updateparams_ + 4) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "KNearestNeighborsClassifier requires a weighting scheme to be set.",0x42);
    std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
  }
  else {
    iVar9 = 0;
    iVar10 = 0;
    if (*(uint32 *)((long)&pNVar5->preprocessing_ + 0x14) == 0x65) {
      iVar10 = (((ClassLabelsUnion *)&(pNVar5->layers_).super_RepeatedPtrFieldBase.rep_)->
                int64classlabels_->vector_).current_size_;
    }
    if (*(uint32 *)((long)&pNVar5->preprocessing_ + 0x14) == 100) {
      iVar9 = *(int *)&(((ClassLabelsUnion *)&(pNVar5->layers_).super_RepeatedPtrFieldBase.rep_)->
                        int64classlabels_->vector_).rep_;
    }
    if (iVar9 < iVar10) {
      iVar9 = iVar10;
    }
    iVar10 = *(int *)&pNVar5->updateparams_;
    if (iVar10 == 0) {
      if (iVar9 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "KNearestNeighborsClassifier should specify default class labels when class labels are not specified."
                   ,100);
        std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
      }
      else {
LAB_0027aeb6:
        bVar4 = false;
LAB_0027aeb9:
        if (format->_oneof_case_[0] == 0x194) {
          pKVar6 = (KNearestNeighborsClassifier *)(format->Type_).pipelineclassifier_;
        }
        else {
          pKVar6 = Specification::KNearestNeighborsClassifier::default_instance();
        }
        validateClassifierInterface<CoreML::Specification::Model,CoreML::Specification::KNearestNeighborsClassifier>
                  ((Result *)local_1b0,(CoreML *)format,(Model *)pKVar6,
                   (KNearestNeighborsClassifier *)0x1,bVar4,(bool)in_R9B);
        local_1d8 = (ostream *)local_1b0;
        std::__cxx11::string::operator=((string *)&local_1d0,(string *)&local_1a8);
        if (local_1a8._M_p != local_1a0 + 8) {
          operator_delete(local_1a8._M_p,local_1a0._8_8_ + 1);
        }
        bVar4 = Result::good((Result *)&local_1d8);
        if (!bVar4) goto LAB_0027af3b;
        if (format->_oneof_case_[0] == 0x194) {
          pKVar6 = (KNearestNeighborsClassifier *)(format->Type_).treeensembleregressor_;
        }
        else {
          pKVar6 = Specification::KNearestNeighborsClassifier::default_instance();
        }
        pNVar11 = pKVar6->nearestneighborsindex_;
        if (pNVar11 == (NearestNeighborsIndex *)0x0) {
          pNVar11 = (NearestNeighborsIndex *)
                    &Specification::_NearestNeighborsIndex_default_instance_;
        }
        iVar10 = (pNVar11->floatsamples_).super_RepeatedPtrFieldBase.current_size_;
        if ((iVar9 == 0) || (iVar10 != 0)) {
          if (iVar10 == iVar9) {
            if (0 < iVar10) {
              iVar10 = 0;
              do {
                pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
                         Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FloatVector>::TypeHandler>
                                   (&(pNVar11->floatsamples_).super_RepeatedPtrFieldBase,iVar10);
                if ((pTVar7->vector_).current_size_ != pNVar11->numberofdimensions_) {
                  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a0,"Unexpected length \"",0x13);
                  poVar8 = (ostream *)
                           std::ostream::operator<<
                                     ((ostream *)local_1a0,
                                      (pNVar11->floatsamples_).super_RepeatedPtrFieldBase.
                                      current_size_);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8,"\" given the provided number of dimensions \"",0x2b);
                  poVar8 = (ostream *)
                           std::ostream::operator<<((ostream *)poVar8,pNVar11->numberofdimensions_);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  std::__cxx11::stringbuf::str();
                  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
                  goto LAB_0027b36d;
                }
                iVar10 = iVar10 + 1;
              } while (iVar10 < (pNVar11->floatsamples_).super_RepeatedPtrFieldBase.current_size_);
            }
            if (pNVar11->_oneof_case_[0] == 100) {
LAB_0027b06f:
              if (pNVar11->_oneof_case_[1] != 0) {
                Result::Result(__return_storage_ptr__);
                goto LAB_0027b3a6;
              }
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,
                         "KNearestNeighborsClassifier requires a distance function to be set.",0x43)
              ;
              std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
            }
            else if (pNVar11->_oneof_case_[0] == 0x6e) {
              if (0 < ((pNVar11->IndexType_).linearindex_)->_cached_size_) goto LAB_0027b06f;
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,
                         "KNearestNeighborsClassifier requires leaf size to be a positive integer.",
                         0x48);
              std::endl<char,std::char_traits<char>>((ostream *)local_1a0);
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a0,
                         "KNearestNeighborsClassifier has no index type specified.",0x38);
              std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
              std::__cxx11::stringbuf::str();
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
            }
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a0,"Unexpected number of labels \"",0x1d);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1a0,iVar9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"\" for the given number of examples: \"",0x25);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)poVar8,
                                (pNVar11->floatsamples_).super_RepeatedPtrFieldBase.current_size_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
          }
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a0,"KNearestNeighborsClassifier has no data points.",0x2f);
          std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
        }
      }
    }
    else {
      uVar2 = *(uint32 *)((long)&pNVar5->preprocessing_ + 0x14);
      if (iVar10 == 0x6e) {
        bVar4 = false;
        if ((uVar2 == 0) || (uVar2 == 100)) goto LAB_0027aeb9;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "KNearestNeighborsClassifier\'s class label and default class label have different types."
                   ,0x57);
        std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
      }
      else {
        if (iVar10 != 0x6f) goto LAB_0027aeb6;
        bVar4 = true;
        if ((uVar2 == 0) || (uVar2 == 0x65)) goto LAB_0027aeb9;
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,
                   "KNearestNeighborsClassifier\'s class label and default class label have different types."
                   ,0x57);
        std::ios::widen((char)*(undefined8 *)(local_1a0._0_8_ - 0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1f8);
      }
    }
  }
LAB_0027b36d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
LAB_0027b3a6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_p != &local_1c0) {
    operator_delete(local_1d0._M_p,
                    CONCAT71(local_1c0._M_allocated_capacity._1_7_,local_1c0._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_kNearestNeighborsClassifier>(const Specification::Model& format) {

        const Specification::KNearestNeighborsClassifier& knnClassifier = format.knearestneighborsclassifier();

        Result res = validateInt64Parameter("numberOfNeighbors", knnClassifier.numberofneighbors(), true);
        if (!res.good()) {
            return res;
        }

        switch (knnClassifier.WeightingScheme_case()) {
            case Specification::KNearestNeighborsClassifier::kUniformWeighting:
            case Specification::KNearestNeighborsClassifier::kInverseDistanceWeighting:
                // Valid weighting scheme
                break;

            case Specification::KNearestNeighborsClassifier::WEIGHTINGSCHEME_NOT_SET:
                std::stringstream out;
                out << "KNearestNeighborsClassifier requires a weighting scheme to be set." << std::endl;
                return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
        }
        
        int intLabelCount = knnClassifier.has_int64classlabels() ? knnClassifier.int64classlabels().vector_size() : 0;
        int stringLabelCount = knnClassifier.has_stringclasslabels() ? knnClassifier.stringclasslabels().vector_size() : 0;
        
        int labelCount = MAX(intLabelCount, stringLabelCount);
        
        auto classLabelCase = knnClassifier.ClassLabels_case();
        auto defaultClassLabelIsInt64 = false;
        
        switch (knnClassifier.DefaultClassLabel_case()) {
            case Specification::KNearestNeighborsClassifier::kDefaultStringLabel:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kStringClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = false;
                break;
                    
            case Specification::KNearestNeighborsClassifier::kDefaultInt64Label:
                if (classLabelCase != Specification::KNearestNeighborsClassifier::CLASSLABELS_NOT_SET &&
                    classLabelCase != Specification::KNearestNeighborsClassifier::kInt64ClassLabels) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier's class label and default class label have different types." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
                defaultClassLabelIsInt64 = true;
                break;
                
            case Specification::KNearestNeighborsClassifier::DEFAULTCLASSLABEL_NOT_SET:
                if (labelCount == 0) {
                    std::stringstream out;
                    out << "KNearestNeighborsClassifier should specify default class labels when class labels are not specified." << std::endl;
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, out.str());
                }
        }
        
        res = validateClassifierInterface(format, format.knearestneighborsclassifier(), true, defaultClassLabelIsInt64);
        if (!res.good()) {
            return res;
        }

        
        return validateNearestNeighborsIndex(format, labelCount);

    }